

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

void mtree_entry_register_free(mtree_writer *mtree)

{
  long in_RDI;
  mtree_entry_conflict *file_next;
  mtree_entry_conflict *file;
  undefined8 local_10;
  
  local_10 = *(long *)(in_RDI + 0x30);
  while (local_10 != 0) {
    local_10 = *(long *)(local_10 + 0x18);
    mtree_entry_free((mtree_entry_conflict *)0x19d346);
  }
  return;
}

Assistant:

static void
mtree_entry_register_free(struct mtree_writer *mtree)
{
	struct mtree_entry *file, *file_next;

	file = mtree->file_list.first;
	while (file != NULL) {
		file_next = file->next;
		mtree_entry_free(file);
		file = file_next;
	}
}